

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O1

string * __thiscall
MD5::getFileChecksum_abi_cxx11_
          (string *__return_storage_ptr__,MD5 *this,char *filename,qpdf_offset_t up_to_offset)

{
  MD5 m;
  MD5 local_30;
  
  MD5(&local_30,(uchar *)this,(size_t)filename,(uchar *)up_to_offset);
  encodeFile(&local_30,(char *)this,(qpdf_offset_t)filename);
  unparse_abi_cxx11_(__return_storage_ptr__,&local_30);
  if (local_30.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
MD5::getFileChecksum(char const* filename, qpdf_offset_t up_to_offset)
{
    MD5 m;
    m.encodeFile(filename, up_to_offset);
    return m.unparse();
}